

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_bitswap(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  Reg RVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  long in_RSI;
  ASMState *in_RDI;
  Reg dest;
  uint32_t rex;
  int n;
  IRIns *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  byte local_24;
  byte *local_18;
  
  RVar2 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffb8,0);
  uVar6 = (RVar2 & 7) * 0x1000000 + 0xc80f00fd;
  uVar5 = 0;
  if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
    uVar5 = 0x80200;
  }
  pMVar1 = in_RDI->mcp;
  *(uint *)(pMVar1 + -4) = uVar6;
  pbVar4 = pMVar1 + ((char)uVar6 + 1);
  iVar3 = (uVar5 >> 1 & 0x104) + 0x40 + (RVar2 >> 3 & 1);
  local_18 = pbVar4;
  if (iVar3 != 0x40) {
    local_24 = (byte)(uVar5 >> 0x10) | (byte)iVar3;
    if ((char)uVar6 == -4) {
      *pbVar4 = local_24;
      local_24 = (byte)(uVar6 >> 8);
    }
    else if ((uVar6 & 0xffffff) == 0x6600fd) {
      *pbVar4 = local_24;
      local_24 = 0x66;
    }
    local_18 = pbVar4 + -1;
    pbVar4[-1] = local_24;
  }
  in_RDI->mcp = local_18;
  ra_left(in_RDI,(Reg)((ulong)in_RSI >> 0x20),(IRRef)in_RSI);
  return;
}

Assistant:

static void asm_bitswap(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, RSET_GPR);
  as->mcp = emit_op(XO_BSWAP + ((dest&7) << 24),
		    REX_64IR(ir, 0), dest, 0, as->mcp, 1);
  ra_left(as, dest, ir->op1);
}